

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.cpp
# Opt level: O1

QString * QMakeMetaInfo::checkLib(QString *__return_storage_ptr__,QString *lib)

{
  Data *pDVar1;
  char cVar2;
  long in_FS_OFFSET;
  QArrayData *local_60;
  undefined8 *local_58;
  QArrayData *local_48;
  undefined8 *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  cVar2 = QFile::exists((QString *)lib);
  if (cVar2 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = (lib->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (lib->d).ptr;
    (__return_storage_ptr__->d).size = (lib->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
    if (Option::debug_level == 0) goto LAB_00296029;
    QString::toLatin1_helper((QString *)&local_48);
    if (local_40 == (undefined8 *)0x0) {
      local_40 = &QByteArray::_empty;
    }
    debug_msg_internal(2,"QMakeMetaInfo: Cannot find info file for %s",local_40);
  }
  else {
    if (Option::debug_level == 0) goto LAB_00296029;
    QString::toLatin1_helper((QString *)&local_48);
    if (local_40 == (undefined8 *)0x0) {
      local_40 = &QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&local_60);
    if (local_58 == (undefined8 *)0x0) {
      local_58 = &QByteArray::_empty;
    }
    debug_msg_internal(2,"QMakeMetaInfo: Found info file %s for %s",local_40,local_58);
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60,1,0x10);
      }
    }
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
LAB_00296029:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
QMakeMetaInfo::checkLib(const QString &lib)
{
    QString ret = QFile::exists(lib) ? lib : QString();
    if(ret.isNull()) {
        debug_msg(2, "QMakeMetaInfo: Cannot find info file for %s", lib.toLatin1().constData());
    } else {
        debug_msg(2, "QMakeMetaInfo: Found info file %s for %s", ret.toLatin1().constData(), lib.toLatin1().constData());
    }
    return ret;
}